

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

uint32_t add_constant(Vm *vm,CrispyValue value)

{
  CallFrame *pCVar1;
  CrispyValue value_00;
  CallFrame *call_frame;
  Vm *vm_local;
  CrispyValue value_local;
  
  value_00.field_1 = value.field_1;
  value_00.type = value.type;
  pCVar1 = (vm->frames).frame_pointers[vm->frame_count - 1];
  if (0xfffe < (pCVar1->constants).count) {
    fprintf(_stderr,"Too many constants.\n");
    exit(0x2d);
  }
  value_00._4_4_ = 0;
  write_value(&pCVar1->constants,value_00);
  return (int)(pCVar1->constants).count - 1;
}

Assistant:

uint32_t add_constant(Vm *vm, CrispyValue value) {
    CallFrame *call_frame = CURR_FRAME(vm);
    if (call_frame->constants.count >= UINT16_MAX) {
        fprintf(stderr, "Too many constants.\n");
        exit(45);
    }

    write_value(&call_frame->constants, value);
    return (uint32_t) (call_frame->constants.count - 1);
}